

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bson.hpp
# Opt level: O2

type __thiscall
jsoncons::bson::decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (bson *this,istream *is,bson_decode_options *options)

{
  ser_error *this_00;
  error_category *peVar1;
  allocator<char> *temp_alloc;
  void *__buf;
  undefined8 extraout_RDX;
  error_code ec;
  type tVar2;
  allocator<char> local_2f1;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  bson_stream_reader reader;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&decoder,(allocator_type *)&reader,(temp_allocator_type *)&adaptor);
  adaptor.
  super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
  .super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_visitor_00998ba8;
  temp_alloc = &local_2f1;
  adaptor.
  super_json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
  .destination1_ = &decoder;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_parser<std::istream&>
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             &reader,is,options,temp_alloc);
  reader.visitor_ = (json_visitor *)&adaptor;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read
            (&reader,(int)is,__buf,(size_t)temp_alloc);
  if (decoder.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
    ~basic_bson_parser(&reader.parser_);
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::~json_decoder(&decoder);
    tVar2.field_0.int64_.val_ = extraout_RDX;
    tVar2.field_0._0_8_ = this;
    return (type)tVar2.field_0;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar1 = conv_error_category();
  ec._M_cat = peVar1;
  ec._0_8_ = 1;
  ser_error::ser_error(this_00,ec,0,reader.parser_.source_.position_);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_bson(std::istream& is, 
                const bson_decode_options& options = bson_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        bson_stream_reader reader(is, adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }